

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall basisu::basisu_frontend::generate_block_endpoint_clusters(basisu_frontend *this)

{
  uint uVar1;
  vec2U *pvVar2;
  long lVar3;
  vector<unsigned_int> *pvVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint32_t new_size;
  uint uVar7;
  
  uVar1 = this->m_total_blocks;
  uVar7 = (this->m_block_endpoint_clusters_indices).m_size;
  if (uVar7 != uVar1) {
    if ((uVar7 <= uVar1) && ((this->m_block_endpoint_clusters_indices).m_capacity < uVar1)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_block_endpoint_clusters_indices,uVar1,
                 uVar7 + 1 == uVar1,8,(object_mover)0x0,false);
    }
    (this->m_block_endpoint_clusters_indices).m_size = uVar1;
  }
  uVar5 = (this->m_endpoint_clusters).m_size;
  if (0 < (int)uVar5) {
    lVar3 = 0;
    do {
      pvVar4 = (this->m_endpoint_clusters).m_p;
      if (pvVar4[lVar3].m_size != 0) {
        pvVar4 = pvVar4 + lVar3;
        uVar6 = 0;
        do {
          uVar1 = pvVar4->m_p[uVar6];
          uVar7 = uVar1 >> 1;
          if ((this->m_block_endpoint_clusters_indices).m_size <= uVar7) goto LAB_0022d6d6;
          (this->m_block_endpoint_clusters_indices).m_p[uVar7].m_comps[uVar1 & 1] = (uint32_t)lVar3;
          uVar6 = uVar6 + 1;
        } while (uVar6 < pvVar4->m_size);
        uVar5 = (this->m_endpoint_clusters).m_size;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)uVar5);
  }
  if (((this->m_params).m_validate == true) && ((ulong)this->m_total_blocks != 0)) {
    pvVar2 = (this->m_block_endpoint_clusters_indices).m_p;
    uVar6 = 0;
    do {
      if ((this->m_block_endpoint_clusters_indices).m_size == uVar6) {
LAB_0022d6d6:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,
                      "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]");
      }
      if (pvVar2[uVar6].m_comps[0] != pvVar2[uVar6].m_comps[1]) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x3e9);
        abort();
      }
      uVar6 = uVar6 + 1;
    } while (this->m_total_blocks != uVar6);
  }
  return;
}

Assistant:

void basisu_frontend::generate_block_endpoint_clusters()
	{
		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_endpoint_clusters.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_endpoint_clusters[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter] >> 1;
				const uint32_t subblock_index = cluster_indices[cluster_indices_iter] & 1;

				m_block_endpoint_clusters_indices[block_index][subblock_index] = cluster_index;

			} // cluster_indices_iter
		}

		if (m_params.m_validate)
		{
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				uint32_t cluster_0 = m_block_endpoint_clusters_indices[block_index][0];
				uint32_t cluster_1 = m_block_endpoint_clusters_indices[block_index][1];
				BASISU_FRONTEND_VERIFY(cluster_0 == cluster_1);
			}
		}
	}